

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uint ON_SubDMeshFragment::QuadGridPointCountFromSideCount(uint side_segment_count)

{
  int iVar1;
  uint uVar2;
  
  if (0xffffffbf < side_segment_count - 0x41) {
    uVar2 = 1;
    do {
      if (uVar2 == side_segment_count) {
        iVar1 = side_segment_count + 1;
        goto LAB_006071c1;
      }
      uVar2 = uVar2 * 2;
    } while (uVar2 <= side_segment_count);
  }
  ON_SubDIncrementErrorCount();
  iVar1 = 0;
LAB_006071c1:
  return iVar1 * iVar1;
}

Assistant:

unsigned int ON_SubDMeshFragment::QuadGridPointCountFromSideCount(
  unsigned int side_segment_count
  )
{
  unsigned int side_point_count = ON_SubDMeshFragment::SidePointCountFromSideCount(side_segment_count);
  return side_point_count*side_point_count;
}